

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cxx
# Opt level: O3

void __thiscall vigra::BmpDecoderImpl::read_1bit_data(BmpDecoderImpl *this)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint i;
  _Ios_Seekdir _Var8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  
  uVar1 = (this->grayscale ^ 1) * 2 + 1;
  uVar12 = (this->info_header).width * uVar1;
  uVar9 = (ulong)((this->info_header).height * uVar12);
  uVar7 = 0;
  std::istream::seekg((long)this,(this->file_header).offset);
  void_vector_base::reserve(&(this->pixels).super_void_vector_base,uVar9);
  (this->pixels).super_void_vector_base.m_size = (this->pixels).super_void_vector_base.m_capacity;
  iVar5 = (this->info_header).width;
  iVar2 = (this->info_header).height;
  iVar6 = iVar5 + 7;
  iVar5 = iVar5 + 0xe;
  if (-1 < iVar6) {
    iVar5 = iVar6;
  }
  iVar6 = (iVar5 >> 3) % 4;
  _Var8 = 4 - iVar6;
  if (iVar6 == 0) {
    _Var8 = _S_beg;
  }
  if (0 < iVar2) {
    lVar10 = uVar9 + (long)(this->pixels).super_void_vector_base.m_data;
    do {
      lVar10 = lVar10 - (ulong)uVar12;
      if (0 < (this->info_header).width) {
        uVar11 = 0;
        lVar13 = lVar10;
        do {
          if ((uVar11 & 7) == 0) {
            uVar7 = std::istream::get();
          }
          pvVar3 = (this->map).super_void_vector_base.m_data;
          uVar9 = 0;
          do {
            *(undefined1 *)(lVar13 + uVar9) =
                 *(undefined1 *)
                  ((long)pvVar3 + uVar9 + (ulong)((uVar7 >> ((byte)uVar11 & 7 ^ 7) & 1) != 0) * 3);
            uVar9 = uVar9 + 1;
          } while (uVar1 != uVar9);
          lVar13 = lVar13 + (ulong)uVar1;
          uVar11 = uVar11 + 1;
        } while ((int)uVar11 < (this->info_header).width);
      }
      std::istream::seekg((long)this,_Var8);
      bVar4 = 1 < iVar2;
      iVar2 = iVar2 + -1;
    } while (bVar4);
  }
  return;
}

Assistant:

void BmpDecoderImpl::read_1bit_data ()
{
    // these are sizes for the final image
    const unsigned int ncomp = grayscale ? 1 : 3;
    const unsigned int line_size = info_header.width * ncomp;
    const unsigned int image_size = info_header.height * line_size;
    int c = 0;

    // seek to the data
    stream.seekg( file_header.offset, std::ios::beg );

    // make room for the pixels
    pixels.resize(image_size);

    // padding after each line (must end on a 32-bit boundary)
    unsigned int pad_size = ( ( info_header.width + 7 ) / 8 ) % 4;
    if ( pad_size > 0 )
        pad_size = 4 - pad_size;

    // setup the base pointer at one line after the end
    UInt8 * base = pixels.data() + image_size;
    UInt8 * mover = base;

    // read scanlines from bottom to top
    for ( int y = info_header.height - 1; y >= 0; --y ) {

        // set the base pointer to the beginning of the line to be read
        base -= line_size;
        mover = base;

        // read the line from left to right
        for ( int x = 0; x < info_header.width; ++x ) {

            // eventually get a new byte from the stream
            if ( x % 8 == 0 )
                c = stream.get();

            // get the color bit
            const UInt8 index = ( c >> ( 7 - ( x % 8 ) ) ) & 0x01;

            // map and assign the pixel
            const UInt8 * map_base = map.data() + 3 * index;
            for ( unsigned int i = 0; i < ncomp; ++i )
                mover[i] = map_base[i];
            mover += ncomp;
        }

        // advance to the next 32 bit boundary
        stream.seekg( pad_size, std::ios::cur );
    }
}